

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QGles2SwapChain::initSwapChainRenderTarget(QGles2SwapChain *this,QGles2SwapChainRenderTarget *rt)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  QRhiRenderTarget *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = in_RDI;
  QRhiRenderTarget::setRenderPassDescriptor(in_RSI,*(QRhiRenderPassDescriptor **)(in_RDI + 0x14));
  in_RSI[1].super_QRhiResource.m_rhi = *(QRhiImplementation **)(in_RDI + 0x14);
  in_RSI[1].super_QRhiResource.m_id = *(quint64 *)(in_RDI + 0x20);
  qVar4 = QWindow::devicePixelRatio((QWindow *)in_RSI);
  *(float *)&in_RSI[1].super_QRhiResource.m_objectName.d.d = (float)qVar4;
  piVar3 = qBound<int>((int *)0x100000040,piVar3,(int *)in_RSI);
  *(int *)((long)&in_RSI[1].super_QRhiResource.m_objectName.d.d + 4) = *piVar3;
  *(undefined4 *)&in_RSI[1].super_QRhiResource.m_objectName.d.ptr = 1;
  *(uint *)((long)&in_RSI[1].super_QRhiResource.m_objectName.d.ptr + 4) =
       (uint)(*(long *)(in_RDI + 0x10) != 0);
  bVar2 = QFlags<QRhiSwapChain::Flag>::testFlag
                    ((QFlags<QRhiSwapChain::Flag> *)in_RSI,(Flag)((ulong)in_RDI >> 0x20));
  *(bool *)&in_RSI[1].super_QRhiResource.m_objectName.d.size = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGles2SwapChain::initSwapChainRenderTarget(QGles2SwapChainRenderTarget *rt)
{
    rt->setRenderPassDescriptor(m_renderPassDesc); // for the public getter in QRhiRenderTarget
    rt->d.rp = QRHI_RES(QGles2RenderPassDescriptor, m_renderPassDesc);
    rt->d.pixelSize = pixelSize;
    rt->d.dpr = float(m_window->devicePixelRatio());
    rt->d.sampleCount = qBound(1, m_sampleCount, 64);
    rt->d.colorAttCount = 1;
    rt->d.dsAttCount = m_depthStencil ? 1 : 0;
    rt->d.srgbUpdateAndBlend = m_flags.testFlag(QRhiSwapChain::sRGB);
}